

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86.cpp
# Opt level: O2

int __thiscall
ncnn::MatMul_x86::forward
          (MatMul_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  size_t sVar1;
  Allocator *pAVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  void **ppvVar8;
  pointer pMVar9;
  pointer pMVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  pointer pMVar13;
  pointer pMVar14;
  ulong uVar15;
  int *piVar16;
  Mat *pMVar17;
  size_t sVar18;
  uint uVar19;
  Mat *pMVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Allocator *pAVar33;
  ulong uVar34;
  Mat *pMVar35;
  uint uVar36;
  long lVar37;
  Mat local_1d8;
  ulong local_188;
  ulong local_180;
  Mat *local_178;
  Allocator *local_170;
  Mat *local_168;
  Mat *local_160;
  allocator_type local_151;
  MatMul_x86 *local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  int local_130;
  Allocator *local_128;
  int local_120;
  int aiStack_11c [5];
  size_t local_108;
  Allocator *local_100;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  int local_e0;
  Allocator *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  int local_c0;
  size_t local_b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  int local_80;
  Allocator *local_78;
  int local_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  int local_60;
  size_t local_58;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  
  uVar12 = local_1d8.elemsize._4_4_;
  uVar11 = (undefined4)local_1d8.elemsize;
  pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_160 = pMVar20 + 1;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar36 = pMVar20->dims;
  uVar19 = pMVar20[1].dims;
  uVar3 = uVar19;
  if ((int)uVar19 < (int)uVar36) {
    uVar3 = uVar36;
  }
  local_178 = (Mat *)top_blobs;
  local_150 = this;
  if ((uVar36 ^ 1) == 0 && (uVar19 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&_bottom_blobs,2,(allocator_type *)&local_1d8);
    Mat::reshape(&local_1d8,pMVar20,pMVar20->w,1,(Allocator *)0x0);
    pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != &local_1d8) {
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
          else {
            (**(code **)(*(long *)(_bottom_blobs.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start)->allocator + 0x18))();
          }
        }
      }
      pMVar9->cstep = 0;
      pMVar9->data = (void *)0x0;
      pMVar9->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
      pMVar9->dims = 0;
      pMVar9->w = 0;
      pMVar9->h = 0;
      pMVar9->d = 0;
      pMVar9->c = 0;
      pMVar9->data = local_1d8.data;
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar9->refcount = piVar16;
      pMVar9->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      pMVar9->elempack = local_1d8.elempack;
      pMVar9->allocator = local_1d8.allocator;
      pMVar9->dims = local_1d8.dims;
      pMVar9->w = local_1d8.w;
      pMVar9->h = local_1d8.h;
      pMVar9->d = local_1d8.d;
      pMVar9->c = local_1d8.c;
      pMVar9->cstep = local_1d8.cstep;
    }
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (**(code **)(*(long *)local_1d8.allocator + 0x18))();
        }
      }
    }
    iVar24 = 1;
    iVar27 = pMVar20[1].w;
    if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86[-3]) == 0) {
      iVar24 = pMVar20[1].w;
      iVar27 = 1;
    }
    Mat::reshape(&local_1d8,local_160,iVar27,iVar24,(Allocator *)0x0);
    piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start + 1 != &local_1d8) {
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
            free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
          else {
            (**(code **)(*(long *)_bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start[1].allocator + 0x18))();
          }
        }
      }
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].data = local_1d8.data;
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].refcount = piVar16;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elemsize =
           CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].w = local_1d8.w;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].h = local_1d8.h;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].d = local_1d8.d;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].c = local_1d8.c;
      _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
    }
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          free(local_1d8.data);
        }
        else {
          (**(code **)(*(long *)local_1d8.allocator + 0x18))();
        }
      }
    }
    (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
    Mat::reshape(&local_1d8,this_00,1,opt->blob_allocator);
    piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (this_00 != &local_1d8) {
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = this_00->refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (this_00->allocator == (Allocator *)0x0) {
            free(this_00->data);
          }
          else {
            (**(code **)(*(long *)this_00->allocator + 0x18))();
          }
        }
      }
      this_00->data = local_1d8.data;
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      this_00->refcount = piVar16;
      this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      this_00->elempack = local_1d8.elempack;
      this_00->allocator = local_1d8.allocator;
      this_00->dims = local_1d8.dims;
      this_00->w = local_1d8.w;
      this_00->h = local_1d8.h;
      this_00->d = local_1d8.d;
      this_00->c = local_1d8.c;
      this_00->cstep = local_1d8.cstep;
    }
    if (piVar16 == (int *)0x0) goto LAB_004a28c2;
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) goto LAB_004a28c2;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_1d8.allocator + 0x18))();
      goto LAB_004a28c2;
    }
  }
  else {
    if ((uVar36 ^ 2) == 0 && (uVar19 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar36 ^ 1) == 0 && (uVar19 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      Mat::reshape(&local_1d8,pMVar20,pMVar20->w,1,(Allocator *)0x0);
      pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != &local_1d8) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (**(code **)(*(long *)(_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))()
              ;
            }
          }
        }
        pMVar9->cstep = 0;
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
        pMVar9->dims = 0;
        pMVar9->w = 0;
        pMVar9->h = 0;
        pMVar9->d = 0;
        pMVar9->c = 0;
        pMVar9->data = local_1d8.data;
        piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar9->refcount = piVar16;
        pMVar9->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        pMVar9->elempack = local_1d8.elempack;
        pMVar9->allocator = local_1d8.allocator;
        pMVar9->dims = local_1d8.dims;
        pMVar9->w = local_1d8.w;
        pMVar9->h = local_1d8.h;
        pMVar9->d = local_1d8.d;
        pMVar9->c = local_1d8.c;
        pMVar9->cstep = local_1d8.cstep;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (**(code **)(*(long *)local_1d8.allocator + 0x18))();
          }
        }
      }
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar20) {
        piVar16 = pMVar20[1].refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (**(code **)(*(long *)_bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1].allocator + 0x18))()
              ;
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].refcount + 4) = 0;
        *(undefined8 *)
         ((long)&_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = (void *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = 0;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = 0;
        piVar16 = pMVar20[1].refcount;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = pMVar20[1].data;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar16;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize = pMVar20[1].elemsize;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = pMVar20[1].elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = pMVar20[1].allocator;
        iVar27 = pMVar20[1].w;
        iVar24 = pMVar20[1].h;
        iVar29 = pMVar20[1].d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = pMVar20[1].dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = iVar27;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = iVar24;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = iVar29;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = pMVar20[1].c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = pMVar20[1].cstep;
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
      Mat::reshape(&local_1d8,this_00,this_00->w,opt->blob_allocator);
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = this_00->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (**(code **)(*(long *)this_00->allocator + 0x18))();
            }
          }
        }
        this_00->data = local_1d8.data;
        piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->refcount = piVar16;
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar16 == (int *)0x0) goto LAB_004a28c2;
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) goto LAB_004a28c2;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_1d8.allocator + 0x18))();
        goto LAB_004a28c2;
      }
    }
    else {
      if ((uVar36 ^ 2) != 0 || (uVar19 ^ 1) != 0) {
        sVar1 = pMVar20->elemsize;
        if ((int)uVar19 < 3 || uVar36 != 1) {
          if ((int)uVar36 < 3 || uVar19 != 1) {
            local_1d8.elemsize._0_4_ = (undefined4)sVar1;
            local_1d8.elemsize._4_4_ = (undefined4)(sVar1 >> 0x20);
            if (uVar3 == 4) {
              if (uVar36 == 3) {
                local_1d8.elemsize._0_4_ = uVar11;
                local_1d8.elemsize._4_4_ = uVar12;
                Mat::reshape(&local_1d8,pMVar20,pMVar20->w,pMVar20->h,pMVar20->c,1,(Allocator *)0x0)
                ;
              }
              else {
                local_1d8.data = pMVar20->data;
                piVar16 = pMVar20->refcount;
                local_1d8.refcount._0_4_ = SUB84(piVar16,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
                local_1d8.elempack = pMVar20->elempack;
                local_1d8.allocator = pMVar20->allocator;
                uVar6 = pMVar20->w;
                uVar7 = pMVar20->h;
                local_1d8.d = pMVar20->d;
                local_1d8.c = pMVar20->c;
                local_1d8.cstep = pMVar20->cstep;
                local_1d8.dims = uVar36;
                local_1d8.w = uVar6;
                local_1d8.h = uVar7;
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + 1;
                  UNLOCK();
                }
              }
              if (uVar19 == 3) {
                Mat::reshape((Mat *)&_bottom_blobs,local_160,pMVar20[1].w,pMVar20[1].h,pMVar20[1].c,
                             1,(Allocator *)0x0);
              }
              else {
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar20[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar20[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar20[1].elemsize;
                local_130 = pMVar20[1].elempack;
                local_128 = pMVar20[1].allocator;
                local_120 = pMVar20[1].dims;
                aiStack_11c[0] = pMVar20[1].w;
                aiStack_11c[1] = pMVar20[1].h;
                aiStack_11c[2] = pMVar20[1].d;
                aiStack_11c[3] = pMVar20[1].c;
                local_108 = pMVar20[1].cstep;
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + 1;
                  UNLOCK();
                }
              }
              uVar36 = aiStack_11c[2];
              if (aiStack_11c[2] < local_1d8.d) {
                uVar36 = local_1d8.d;
              }
              pMVar20 = (Mat *)(ulong)uVar36;
              uVar19 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1d8.c) {
                uVar19 = local_1d8.c;
              }
              pMVar35 = (Mat *)(ulong)uVar19;
              Mat::create(this_00,aiStack_11c
                                  [*(int *)(&local_150->field_0xd0 +
                                           (long)local_150->_vptr_MatMul_x86[-3]) != 0],local_1d8.h,
                          uVar36,uVar19,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (**(code **)(*(long *)local_128 + 0x18))();
                    }
                  }
                }
                piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar16 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (**(code **)(*(long *)local_1d8.allocator + 0x18))();
                  return -100;
                }
                goto LAB_004a3510;
              }
              if ((int)uVar36 < 1) {
                pMVar20 = (Mat *)0x0;
              }
              if ((int)uVar19 < 1) {
                pMVar35 = (Mat *)0x0;
              }
              pMVar17 = (Mat *)0x0;
              local_168 = pMVar20;
              while (pMVar17 != pMVar35) {
                local_188 = (ulong)pMVar17 & 0xffffffff;
                local_180 = local_188;
                if (local_1d8.c == 1) {
                  local_180 = 0;
                }
                if (aiStack_11c[3] == 1) {
                  local_188 = 0;
                }
                pMVar20 = (Mat *)0x0;
                local_160 = pMVar17;
                while( true ) {
                  if (local_168 == pMVar20) break;
                  iVar29 = local_1d8.d;
                  iVar28 = aiStack_11c[2];
                  local_178 = pMVar20;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                  pMVar9 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar24 = local_1d8.h;
                  iVar27 = local_1d8.w;
                  pvVar21 = local_1d8.data;
                  lVar22 = (long)local_1d8.w;
                  lVar23 = (long)local_1d8.h;
                  lVar37 = local_1d8.cstep * local_180;
                  sVar1 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                  pMVar20 = local_178;
                  if (iVar29 == 1) {
                    pMVar20 = (Mat *)0x0;
                  }
                  piVar16 = (_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  pAVar33 = local_1d8.allocator;
                  iVar29 = local_1d8.elempack;
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      local_100 = local_1d8.allocator;
                      local_170 = (Allocator *)CONCAT44(local_170._4_4_,local_1d8.elempack);
                      if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                        pAVar33 = local_100;
                        iVar29 = (int)local_170;
                      }
                      else {
                        (**(code **)(*(long *)(_bottom_blobs_5.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->allocator
                                    + 0x18))();
                        pAVar33 = local_100;
                        iVar29 = (int)local_170;
                      }
                    }
                  }
                  pMVar14 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pMVar10 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  pMVar9->data = (void *)((long)pvVar21 +
                                         (long)pMVar20 * lVar23 * lVar22 * sVar1 + lVar37 * sVar1);
                  pMVar9->refcount = (int *)0x0;
                  pMVar9->elemsize = sVar1;
                  pMVar9->elempack = iVar29;
                  pMVar9->allocator = pAVar33;
                  pMVar9->dims = 2;
                  pMVar9->w = iVar27;
                  pMVar9->h = iVar24;
                  pMVar9->d = 1;
                  pMVar9->c = 1;
                  pMVar9->cstep = lVar23 * lVar22;
                  iVar27 = aiStack_11c[1];
                  lVar22 = (long)aiStack_11c[1];
                  lVar23 = local_108 * local_188 *
                           (long)_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                  piVar16 = _bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start[1].refcount;
                  pMVar20 = local_178;
                  if (iVar28 == 1) {
                    pMVar20 = (Mat *)0x0;
                  }
                  pAVar33 = local_128;
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      local_170 = local_128;
                      if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0)
                      {
                        free(_bottom_blobs_5.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start[1].data);
                        pAVar33 = local_170;
                      }
                      else {
                        (**(code **)(*(long *)_bottom_blobs_5.
                                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].allocator
                                    + 0x18))();
                        pAVar33 = local_170;
                      }
                    }
                  }
                  pMVar14[1].data =
                       (void *)((long)&pMVar13->data +
                               (long)pMVar20 * lVar22 * aiStack_11c[0] * (long)pMVar10 + lVar23);
                  pMVar14[1].refcount = (int *)0x0;
                  pMVar14[1].elemsize = (size_t)pMVar10;
                  pMVar14[1].elempack = local_130;
                  pMVar14[1].allocator = pAVar33;
                  pMVar14[1].dims = 2;
                  pMVar14[1].w = aiStack_11c[0];
                  pMVar14[1].h = iVar27;
                  pMVar14[1].d = 1;
                  pMVar14[1].c = 1;
                  pMVar14[1].cstep = lVar22 * aiStack_11c[0];
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                  pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar27 = this_00->w;
                  iVar24 = this_00->h;
                  lVar22 = this_00->cstep * (long)local_160;
                  sVar1 = this_00->elemsize;
                  pvVar21 = this_00->data;
                  iVar29 = this_00->elempack;
                  pAVar33 = this_00->allocator;
                  piVar16 = (_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start)->refcount;
                  if (piVar16 != (int *)0x0) {
                    LOCK();
                    *piVar16 = *piVar16 + -1;
                    UNLOCK();
                    if (*piVar16 == 0) {
                      if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0
                         ) {
                        free((_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->data);
                      }
                      else {
                        (**(code **)(*(long *)(_bottom_blobs_3.
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->allocator
                                    + 0x18))();
                      }
                    }
                  }
                  pMVar20 = local_178;
                  sVar18 = (long)iVar24 * (long)iVar27;
                  pMVar9->data = (void *)((long)pvVar21 +
                                         (long)local_178 * sVar1 * sVar18 + lVar22 * sVar1);
                  pMVar9->refcount = (int *)0x0;
                  pMVar9->elemsize = sVar1;
                  pMVar9->elempack = iVar29;
                  pMVar9->allocator = pAVar33;
                  pMVar9->dims = 2;
                  pMVar9->w = iVar27;
                  pMVar9->h = iVar24;
                  pMVar9->d = 1;
                  pMVar9->c = 1;
                  pMVar9->cstep = sVar18;
                  (*local_150->gemm->_vptr_Layer[6])
                            (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,opt);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                  pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                }
                pMVar17 = (Mat *)((long)&local_160->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (**(code **)(*(long *)local_128 + 0x18))();
                  }
                }
              }
              piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar16 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (**(code **)(*(long *)local_1d8.allocator + 0x18))();
                return 0;
              }
            }
            else {
              if (uVar3 != 3) {
                fprintf(_stderr,"impossible matmul %d %d",(ulong)uVar36,(ulong)uVar19);
                fputc(10,_stderr);
                return -1;
              }
              if (uVar36 == 2) {
                local_1d8.elemsize._0_4_ = uVar11;
                local_1d8.elemsize._4_4_ = uVar12;
                Mat::reshape(&local_1d8,pMVar20,pMVar20->w,pMVar20->h,1,(Allocator *)0x0);
              }
              else {
                local_1d8.data = pMVar20->data;
                piVar16 = pMVar20->refcount;
                local_1d8.refcount._0_4_ = SUB84(piVar16,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)piVar16 >> 0x20);
                local_1d8.elempack = pMVar20->elempack;
                local_1d8.allocator = pMVar20->allocator;
                uVar4 = pMVar20->w;
                uVar5 = pMVar20->h;
                local_1d8.d = pMVar20->d;
                local_1d8.c = pMVar20->c;
                local_1d8.cstep = pMVar20->cstep;
                local_1d8.dims = uVar36;
                local_1d8.w = uVar4;
                local_1d8.h = uVar5;
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + 1;
                  UNLOCK();
                }
              }
              if (uVar19 == 2) {
                Mat::reshape((Mat *)&_bottom_blobs,local_160,pMVar20[1].w,pMVar20[1].h,1,
                             (Allocator *)0x0);
              }
              else {
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)pMVar20[1].data;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pMVar20[1].refcount;
                _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)pMVar20[1].elemsize;
                local_130 = pMVar20[1].elempack;
                local_128 = pMVar20[1].allocator;
                local_120 = pMVar20[1].dims;
                aiStack_11c[0] = pMVar20[1].w;
                aiStack_11c[1] = pMVar20[1].h;
                aiStack_11c[2] = pMVar20[1].d;
                aiStack_11c[3] = pMVar20[1].c;
                local_108 = pMVar20[1].cstep;
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + 1;
                  UNLOCK();
                }
              }
              uVar36 = aiStack_11c[3];
              if (aiStack_11c[3] < local_1d8.c) {
                uVar36 = local_1d8.c;
              }
              pMVar20 = (Mat *)(ulong)uVar36;
              Mat::create(this_00,aiStack_11c
                                  [*(int *)(&local_150->field_0xd0 +
                                           (long)local_150->_vptr_MatMul_x86[-3]) != 0],local_1d8.h,
                          uVar36,sVar1,opt->blob_allocator);
              if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
                if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) {
                  LOCK();
                  *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->data =
                       *(int *)&(_bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish)->data + -1;
                  UNLOCK();
                  if (*(int *)&(_bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish)->data == 0) {
                    if (local_128 == (Allocator *)0x0) {
                      free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      (**(code **)(*(long *)local_128 + 0x18))();
                    }
                  }
                }
                piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar16 == (int *)0x0) {
                  return -100;
                }
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 != 0) {
                  return -100;
                }
                if (local_1d8.allocator != (Allocator *)0x0) {
                  (**(code **)(*(long *)local_1d8.allocator + 0x18))();
                  return -100;
                }
LAB_004a3510:
                free(local_1d8.data);
                return -100;
              }
              if ((int)uVar36 < 1) {
                pMVar20 = (Mat *)0x0;
              }
              pMVar35 = (Mat *)0x0;
              local_160 = pMVar20;
              while( true ) {
                iVar27 = aiStack_11c[3];
                if (local_160 == pMVar35) break;
                iVar28 = local_1d8.c;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_5,2,(allocator_type *)&_bottom_blobs_3);
                pMVar9 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                iVar29 = local_1d8.dims;
                iVar24 = local_1d8.elempack;
                uVar34 = (ulong)local_1d8.w;
                uVar15 = (ulong)local_1d8.h;
                pMVar20 = pMVar35;
                if (iVar28 == 1) {
                  pMVar20 = (Mat *)0x0;
                }
                uVar30 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                pvVar21 = (void *)((long)pMVar20 * local_1d8.cstep * uVar30 + (long)local_1d8.data);
                uVar31 = (uVar30 * uVar15 * uVar34 + 0xf & 0xfffffffffffffff0) / uVar30;
                if (local_1d8.dims == 4) {
                  uVar31 = uVar15 * uVar34;
                }
                piVar16 = (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                pAVar33 = local_1d8.allocator;
                iVar26 = local_1d8.d;
                iVar28 = local_1d8.w;
                iVar25 = local_1d8.h;
                local_178 = pMVar35;
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + -1;
                  UNLOCK();
                  if (*piVar16 == 0) {
                    local_170 = local_1d8.allocator;
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,local_1d8.d);
                    local_180 = uVar34;
                    local_188 = uVar15;
                    if ((_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                      free((_bottom_blobs_5.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      iVar28 = (int)local_180;
                      iVar25 = (int)local_188;
                      pAVar33 = local_170;
                      iVar26 = (uint)local_168;
                    }
                    else {
                      (**(code **)(*(long *)(_bottom_blobs_5.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->allocator +
                                  0x18))();
                      iVar28 = (int)local_180;
                      iVar25 = (int)local_188;
                      pAVar33 = local_170;
                      iVar26 = (uint)local_168;
                    }
                  }
                }
                pMVar10 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar13 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
                pMVar9->refcount = (int *)0x0;
                pMVar9->data = pvVar21;
                pMVar9->elemsize = uVar30;
                pMVar9->elempack = iVar24;
                pMVar9->allocator = pAVar33;
                pMVar9->dims = iVar29 - 1;
                pMVar9->w = iVar28;
                pMVar9->h = iVar25;
                pMVar9->d = 1;
                pMVar9->c = iVar26;
                pMVar9->cstep = uVar31;
                uVar34 = (ulong)aiStack_11c[0];
                iVar24 = aiStack_11c[1];
                pMVar20 = local_178;
                if (iVar27 == 1) {
                  pMVar20 = (Mat *)0x0;
                }
                lVar22 = (long)pMVar20 * local_108 *
                         (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                ppvVar8 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start)->data;
                uVar30 = (long)_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage *
                         (long)aiStack_11c[1] * uVar34 + 0xf & 0xfffffffffffffff0;
                uVar15 = uVar30 / (ulong)_bottom_blobs.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_120 == 4) {
                  uVar15 = (long)aiStack_11c[1] * uVar34;
                }
                piVar16 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].refcount;
                iVar29 = aiStack_11c[2];
                iVar27 = aiStack_11c[0];
                iVar28 = local_130;
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + -1;
                  UNLOCK();
                  if (*piVar16 == 0) {
                    local_188 = CONCAT44(local_188._4_4_,local_130);
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,aiStack_11c[2]);
                    pAVar33 = _bottom_blobs_5.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start[1].allocator;
                    local_180 = uVar34;
                    if (pAVar33 == (Allocator *)0x0) {
                      free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].data);
                      iVar27 = (int)local_180;
                      iVar29 = (uint)local_168;
                      iVar28 = (int)local_188;
                    }
                    else {
                      (**(code **)(*(long *)pAVar33 + 0x18))
                                (pAVar33,_bottom_blobs_5.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start[1].data,
                                 uVar30 % (ulong)_bottom_blobs.
                                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                      ;
                      iVar27 = (int)local_180;
                      iVar29 = (uint)local_168;
                      iVar28 = (int)local_188;
                    }
                  }
                }
                pMVar10[1].data = (void **)((long)ppvVar8 + lVar22);
                pMVar10[1].refcount = (int *)0x0;
                pMVar10[1].elemsize = (size_t)pMVar13;
                pMVar10[1].elempack = iVar28;
                pMVar10[1].allocator = local_128;
                pMVar10[1].dims = local_120 + -1;
                pMVar10[1].w = iVar27;
                pMVar10[1].h = iVar24;
                pMVar10[1].d = 1;
                pMVar10[1].c = iVar29;
                pMVar10[1].cstep = uVar15;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          (&_bottom_blobs_3,1,(allocator_type *)&_top_blobs);
                pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar15 = (ulong)this_00->w;
                iVar27 = this_00->h;
                iVar24 = this_00->d;
                lVar22 = this_00->cstep * (long)local_178;
                uVar34 = this_00->elemsize;
                pvVar21 = this_00->data;
                iVar29 = this_00->elempack;
                pAVar33 = this_00->allocator;
                uVar32 = (long)iVar27 * uVar15;
                uVar31 = uVar32 * uVar34 + 0xf & 0xfffffffffffffff0;
                iVar28 = this_00->dims;
                uVar30 = uVar31 / uVar34;
                if (iVar28 == 4) {
                  uVar30 = uVar32;
                }
                piVar16 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->refcount;
                if (piVar16 != (int *)0x0) {
                  LOCK();
                  *piVar16 = *piVar16 + -1;
                  UNLOCK();
                  if (*piVar16 == 0) {
                    local_188 = CONCAT44(local_188._4_4_,iVar29);
                    local_168 = (Mat *)CONCAT44(local_168._4_4_,iVar24);
                    pAVar2 = (_bottom_blobs_3.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start)->allocator;
                    local_180 = uVar15;
                    if (pAVar2 == (Allocator *)0x0) {
                      free((_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start)->data);
                      uVar15 = local_180;
                      iVar24 = (uint)local_168;
                      iVar29 = (int)local_188;
                    }
                    else {
                      (**(code **)(*(long *)pAVar2 + 0x18))
                                (pAVar2,(_bottom_blobs_3.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->data,
                                 uVar31 % uVar34);
                      uVar15 = local_180;
                      iVar24 = (uint)local_168;
                      iVar29 = (int)local_188;
                    }
                  }
                }
                pMVar9->data = (void *)(lVar22 * uVar34 + (long)pvVar21);
                pMVar9->refcount = (int *)0x0;
                pMVar9->elemsize = uVar34;
                pMVar9->elempack = iVar29;
                pMVar9->allocator = pAVar33;
                pMVar9->dims = iVar28 + -1;
                pMVar9->w = (int)uVar15;
                pMVar9->h = iVar27;
                pMVar9->d = 1;
                pMVar9->c = iVar24;
                pMVar9->cstep = uVar30;
                (*local_150->gemm->_vptr_Layer[6])
                          (local_150->gemm,&_bottom_blobs_5,&_bottom_blobs_3,opt);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_5);
                pMVar35 = (Mat *)((long)&local_178->data + 1);
              }
              if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + -1;
                UNLOCK();
                if (*(int *)&(_bottom_blobs.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish)->data == 0) {
                  if (local_128 == (Allocator *)0x0) {
                    free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                  else {
                    (**(code **)(*(long *)local_128 + 0x18))();
                  }
                }
              }
              piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar16 == (int *)0x0) {
                return 0;
              }
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 != 0) {
                return 0;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (**(code **)(*(long *)local_1d8.allocator + 0x18))();
                return 0;
              }
            }
            goto LAB_004a398a;
          }
          uVar19 = pMVar20->c * pMVar20->d;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          local_100 = (Allocator *)CONCAT44(local_100._4_4_,pMVar20->h);
          Mat::create(&local_1d8,1,pMVar20->h,uVar19,sVar1,opt->blob_allocator);
          if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
            piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar16 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 != 0) {
              return -100;
            }
            if (local_1d8.allocator != (Allocator *)0x0) {
              (**(code **)(*(long *)local_1d8.allocator + 0x18))();
              return -100;
            }
            goto LAB_004a3510;
          }
          Mat::reshape((Mat *)&_bottom_blobs,pMVar20,pMVar20->w,pMVar20->h,uVar19,(Allocator *)0x0);
          iVar24 = 1;
          iVar27 = pMVar20[1].w;
          if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86[-3]) == 0) {
            iVar24 = pMVar20[1].w;
            iVar27 = 1;
          }
          pMVar35 = (Mat *)0x0;
          Mat::reshape((Mat *)&_bottom_blobs_5,local_160,iVar27,iVar24,(Allocator *)0x0);
          local_160 = (Mat *)(ulong)uVar19;
          if ((int)uVar19 < 1) {
            local_160 = pMVar35;
          }
          while( true ) {
            if (local_160 == pMVar35) break;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
            pMVar13 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
            uVar31 = (ulong)aiStack_11c[0];
            uVar34 = (ulong)aiStack_11c[1];
            lVar22 = local_108 * (long)pMVar35 *
                     (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            ppvVar8 = &(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data;
            uVar30 = (long)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage * uVar34 * uVar31 + 0xf
                     & 0xfffffffffffffff0;
            uVar15 = uVar30 / (ulong)_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (local_120 == 4) {
              uVar15 = uVar34 * uVar31;
            }
            piVar16 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            pAVar33 = local_128;
            iVar24 = aiStack_11c[2];
            iVar27 = aiStack_11c[0];
            local_178 = pMVar35;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                local_170 = local_128;
                local_168 = (Mat *)CONCAT44(local_168._4_4_,aiStack_11c[2]);
                pAVar33 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar31;
                local_188 = uVar34;
                if (pAVar33 == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                  iVar27 = (int)local_180;
                  uVar34 = local_188;
                  pAVar33 = local_170;
                  iVar24 = (uint)local_168;
                }
                else {
                  (**(code **)(*(long *)pAVar33 + 0x18))
                            (pAVar33,(_bottom_blobs_3.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar30 % (ulong)_bottom_blobs.
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar27 = (int)local_180;
                  uVar34 = local_188;
                  pAVar33 = local_170;
                  iVar24 = (uint)local_168;
                }
              }
            }
            pMVar10 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar35 = local_178;
            pMVar13->data = (void **)((long)ppvVar8 + lVar22);
            pMVar13->refcount = (int *)0x0;
            pMVar13->elemsize = (size_t)pMVar9;
            pMVar13->elempack = local_130;
            pMVar13->allocator = pAVar33;
            pMVar13->dims = local_120 + -1;
            pMVar13->w = iVar27;
            pMVar13->h = (int)uVar34;
            pMVar13->d = 1;
            pMVar13->c = iVar24;
            pMVar13->cstep = uVar15;
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start + 1 != (pointer)&_bottom_blobs_5) {
              if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_5.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar16 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].refcount;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                    free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].data);
                  }
                  else {
                    (**(code **)(*(long *)_bottom_blobs_3.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start[1].allocator +
                                0x18))();
                  }
                }
              }
              pMVar10[1].data =
                   _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pMVar10[1].refcount =
                   (int *)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              pMVar10[1].elemsize =
                   (size_t)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pMVar10[1].elempack = local_80;
              pMVar10[1].allocator = local_78;
              pMVar10[1].dims = local_70;
              pMVar10[1].w = iStack_6c;
              pMVar10[1].h = iStack_68;
              pMVar10[1].d = iStack_64;
              pMVar10[1].c = local_60;
              pMVar10[1].cstep = local_58;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_151);
            pMVar9 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar24 = local_1d8.dims;
            iVar27 = local_1d8.elempack;
            uVar32 = (ulong)local_1d8.w;
            uVar15 = (ulong)local_1d8.h;
            uVar34 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
            pvVar21 = (void *)(local_1d8.cstep * (long)pMVar35 * uVar34 + (long)local_1d8.data);
            uVar31 = uVar34 * uVar15 * uVar32 + 0xf & 0xfffffffffffffff0;
            uVar30 = uVar31 / uVar34;
            if (local_1d8.dims == 4) {
              uVar30 = uVar15 * uVar32;
            }
            piVar16 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            pAVar33 = local_1d8.allocator;
            iVar28 = local_1d8.d;
            iVar29 = local_1d8.w;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                local_170 = local_1d8.allocator;
                local_168 = (Mat *)CONCAT44(local_168._4_4_,local_1d8.d);
                pAVar33 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator;
                local_180 = uVar32;
                local_188 = uVar15;
                if (pAVar33 == (Allocator *)0x0) {
                  free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                        .super__Vector_impl_data._M_start)->data);
                  iVar29 = (int)local_180;
                  uVar15 = local_188;
                  pAVar33 = local_170;
                  iVar28 = (uint)local_168;
                }
                else {
                  (**(code **)(*(long *)pAVar33 + 0x18))
                            (pAVar33,(_top_blobs.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->data,
                             uVar31 % uVar34);
                  iVar29 = (int)local_180;
                  uVar15 = local_188;
                  pAVar33 = local_170;
                  iVar28 = (uint)local_168;
                }
              }
            }
            pMVar9->data = pvVar21;
            pMVar9->refcount = (int *)0x0;
            pMVar9->elemsize = uVar34;
            pMVar9->elempack = iVar27;
            pMVar9->allocator = pAVar33;
            pMVar9->dims = iVar24 - 1;
            pMVar9->w = iVar29;
            pMVar9->h = (int)uVar15;
            pMVar9->d = 1;
            pMVar9->c = iVar28;
            pMVar9->cstep = uVar30;
            (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs_3,&_top_blobs,opt);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
            pMVar35 = (Mat *)((long)&local_178->data + 1);
          }
          if (uVar36 == 3) {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar20->c * pMVar20->d,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar16 = this_00->refcount;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (**(code **)(*(long *)this_00->allocator + 0x18))();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) {
LAB_004a38e3:
                  free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start);
                }
                else {
                  (**(code **)(*(long *)local_d8 + 0x18))();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar20->d,pMVar20->c,
                         opt->blob_allocator);
            if (this_00 != (Mat *)&_bottom_blobs_3) {
              if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                LOCK();
                *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data =
                     *(int *)&(_bottom_blobs_3.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish)->data + 1;
                UNLOCK();
              }
              piVar16 = this_00->refcount;
              if (piVar16 != (int *)0x0) {
                LOCK();
                *piVar16 = *piVar16 + -1;
                UNLOCK();
                if (*piVar16 == 0) {
                  if (this_00->allocator == (Allocator *)0x0) {
                    free(this_00->data);
                  }
                  else {
                    (**(code **)(*(long *)this_00->allocator + 0x18))();
                  }
                }
              }
              this_00->data =
                   _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
              this_00->refcount =
                   (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              this_00->elemsize =
                   (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              this_00->elempack = local_e0;
              this_00->allocator = local_d8;
              this_00->dims = local_d0;
              this_00->w = iStack_cc;
              this_00->h = iStack_c8;
              this_00->d = iStack_c4;
              this_00->c = local_c0;
              this_00->cstep = local_b8;
            }
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + -1;
              UNLOCK();
              if (*(int *)&(_bottom_blobs_3.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data._M_finish)->data == 0) {
                if (local_d8 == (Allocator *)0x0) goto LAB_004a38e3;
                (**(code **)(*(long *)local_d8 + 0x18))();
              }
            }
          }
          if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_78 == (Allocator *)0x0) {
                free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (**(code **)(*(long *)local_78 + 0x18))();
              }
            }
          }
          if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_128 == (Allocator *)0x0) {
                free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                     .super__Vector_impl_data._M_start);
              }
              else {
                (**(code **)(*(long *)local_128 + 0x18))();
              }
            }
          }
          piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar16 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 != 0) {
            return 0;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_1d8.allocator + 0x18))();
            return 0;
          }
          goto LAB_004a398a;
        }
        uVar36 = pMVar20[1].c * pMVar20[1].d;
        local_1d8.cstep = 0;
        local_1d8.data = (void *)0x0;
        local_1d8.refcount._0_4_ = 0;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.elemsize._0_4_ = 0;
        local_1d8.elemsize._4_4_ = 0;
        local_1d8.elempack = 0;
        local_1d8.allocator = (Allocator *)0x0;
        local_1d8.dims = 0;
        local_1d8.w = 0;
        local_1d8.h = 0;
        local_1d8.d = 0;
        local_1d8.c = 0;
        local_100 = (Allocator *)
                    CONCAT44(local_100._4_4_,
                             (&pMVar20[1].w)
                             [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86[-3]) != 0]);
        Mat::create(&local_1d8,
                    (&pMVar20[1].w)
                    [*(int *)(&this->field_0xd0 + (long)this->_vptr_MatMul_x86[-3]) != 0],1,uVar36,
                    sVar1,opt->blob_allocator);
        if ((local_1d8.data == (void *)0x0) || ((long)local_1d8.c * local_1d8.cstep == 0)) {
          piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar16 == (int *)0x0) {
            return -100;
          }
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 != 0) {
            return -100;
          }
          if (local_1d8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_1d8.allocator + 0x18))();
            return -100;
          }
          goto LAB_004a3510;
        }
        Mat::reshape((Mat *)&_bottom_blobs,pMVar20,pMVar20->w,1,(Allocator *)0x0);
        pMVar35 = (Mat *)0x0;
        Mat::reshape((Mat *)&_bottom_blobs_5,local_160,pMVar20[1].w,pMVar20[1].h,uVar36,
                     (Allocator *)0x0);
        local_160 = (Mat *)(ulong)uVar36;
        if ((int)uVar36 < 1) {
          local_160 = pMVar35;
        }
        local_168 = (Mat *)CONCAT44(local_168._4_4_,uVar19);
        while (local_160 != pMVar35) {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&_bottom_blobs_3,2,(allocator_type *)&_top_blobs);
          pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)&_bottom_blobs) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar16 = (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                       _M_impl.super__Vector_impl_data._M_start)->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if ((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  free((_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start)->data);
                }
                else {
                  (**(code **)(*(long *)(_bottom_blobs_3.
                                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->allocator + 0x18
                              ))();
                }
              }
            }
            pMVar9->cstep = 0;
            pMVar9->data = (void *)0x0;
            pMVar9->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
            pMVar9->c = 0;
            pMVar9->dims = 0;
            pMVar9->w = 0;
            pMVar9->h = 0;
            pMVar9->d = 0;
            pMVar9->data = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            pMVar9->refcount =
                 (int *)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            pMVar9->elemsize =
                 (size_t)_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            pMVar9->elempack = local_130;
            pMVar9->allocator = local_128;
            pMVar9->dims = local_120;
            pMVar9->w = aiStack_11c[0];
            pMVar9->h = aiStack_11c[1];
            pMVar9->d = aiStack_11c[2];
            pMVar9->c = aiStack_11c[3];
            pMVar9->cstep = local_108;
          }
          pMVar13 = _bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          pMVar9 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar30 = (ulong)iStack_6c;
          lVar22 = local_58 * (long)pMVar35 *
                   (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          ppvVar8 = &(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start)->data;
          uVar15 = (long)_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage *
                   (long)iStack_68 * uVar30 + 0xf & 0xfffffffffffffff0;
          uVar34 = uVar15 / (ulong)_bottom_blobs_5.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage;
          if (local_70 == 4) {
            uVar34 = (long)iStack_68 * uVar30;
          }
          piVar16 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pAVar33 = local_78;
          iVar24 = iStack_64;
          iVar27 = iStack_6c;
          local_178 = pMVar35;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              local_170 = local_78;
              local_180 = CONCAT44(local_180._4_4_,iStack_64);
              pAVar33 = _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].allocator;
              local_188 = uVar30;
              if (pAVar33 == (Allocator *)0x0) {
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
                iVar27 = (int)local_188;
                pAVar33 = local_170;
                iVar24 = (int)local_180;
              }
              else {
                (**(code **)(*(long *)pAVar33 + 0x18))
                          (pAVar33,_bottom_blobs_3.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start[1].data,
                           uVar15 % (ulong)_bottom_blobs_5.
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar27 = (int)local_188;
                pAVar33 = local_170;
                iVar24 = (int)local_180;
              }
            }
          }
          pMVar9[1].data = (void **)((long)ppvVar8 + lVar22);
          pMVar9[1].refcount = (int *)0x0;
          pMVar9[1].elemsize = (size_t)pMVar13;
          pMVar9[1].elempack = local_80;
          pMVar9[1].allocator = pAVar33;
          pMVar9[1].dims = local_70 + -1;
          pMVar9[1].w = iVar27;
          pMVar9[1].h = iStack_68;
          pMVar9[1].d = 1;
          pMVar9[1].c = iVar24;
          pMVar9[1].cstep = uVar34;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&_top_blobs,1,&local_151);
          pMVar9 = _top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar29 = local_1d8.h;
          iVar24 = local_1d8.dims;
          iVar27 = local_1d8.elempack;
          uVar31 = (ulong)local_1d8.w;
          uVar34 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
          pvVar21 = (void *)(local_1d8.cstep * (long)local_178 * uVar34 + (long)local_1d8.data);
          uVar30 = uVar34 * (long)local_1d8.h * uVar31 + 0xf & 0xfffffffffffffff0;
          uVar15 = uVar30 / uVar34;
          if (local_1d8.dims == 4) {
            uVar15 = (long)local_1d8.h * uVar31;
          }
          piVar16 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->refcount;
          pAVar33 = local_1d8.allocator;
          iVar25 = local_1d8.d;
          iVar28 = local_1d8.w;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              local_170 = local_1d8.allocator;
              local_180 = CONCAT44(local_180._4_4_,local_1d8.d);
              pAVar33 = (_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start)->allocator;
              local_188 = uVar31;
              if (pAVar33 == (Allocator *)0x0) {
                free((_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start)->data);
                iVar28 = (int)local_188;
                pAVar33 = local_170;
                iVar25 = (int)local_180;
              }
              else {
                (**(code **)(*(long *)pAVar33 + 0x18))
                          (pAVar33,(_top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data,uVar30 % uVar34)
                ;
                iVar28 = (int)local_188;
                pAVar33 = local_170;
                iVar25 = (int)local_180;
              }
            }
          }
          pMVar9->data = pvVar21;
          pMVar9->refcount = (int *)0x0;
          pMVar9->elemsize = uVar34;
          pMVar9->elempack = iVar27;
          pMVar9->allocator = pAVar33;
          pMVar9->dims = iVar24 - 1;
          pMVar9->w = iVar28;
          pMVar9->h = iVar29;
          pMVar9->d = 1;
          pMVar9->c = iVar25;
          pMVar9->cstep = uVar15;
          (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs_3,&_top_blobs,opt);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs_3);
          uVar19 = (uint)local_168;
          pMVar35 = (Mat *)((long)&local_178->data + 1);
        }
        if (uVar19 == 3) {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar20[1].c * pMVar20[1].d
                       ,opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar16 = this_00->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 0x18))();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) {
LAB_004a3685:
                free(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start);
              }
              else {
                (**(code **)(*(long *)local_d8 + 0x18))();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)&_bottom_blobs_3,&local_1d8,(int)local_100,pMVar20[1].d,pMVar20[1].c,
                       opt->blob_allocator);
          if (this_00 != (Mat *)&_bottom_blobs_3) {
            if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              LOCK();
              *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data =
                   *(int *)&(_bottom_blobs_3.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish)->data + 1;
              UNLOCK();
            }
            piVar16 = this_00->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (this_00->allocator == (Allocator *)0x0) {
                  free(this_00->data);
                }
                else {
                  (**(code **)(*(long *)this_00->allocator + 0x18))();
                }
              }
            }
            this_00->data =
                 _bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start;
            this_00->refcount =
                 (int *)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            this_00->elemsize =
                 (size_t)_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
            this_00->elempack = local_e0;
            this_00->allocator = local_d8;
            this_00->dims = local_d0;
            this_00->w = iStack_cc;
            this_00->h = iStack_c8;
            this_00->d = iStack_c4;
            this_00->c = local_c0;
            this_00->cstep = local_b8;
          }
          if (_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            LOCK();
            *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_finish)->data =
                 *(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->data + -1;
            UNLOCK();
            if (*(int *)&(_bottom_blobs_3.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
              if (local_d8 == (Allocator *)0x0) goto LAB_004a3685;
              (**(code **)(*(long *)local_d8 + 0x18))();
            }
          }
        }
        if (_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_78 == (Allocator *)0x0) {
              free(_bottom_blobs_5.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start);
            }
            else {
              (**(code **)(*(long *)local_78 + 0x18))();
            }
          }
        }
        if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          LOCK();
          *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_finish)->data =
               *(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->data + -1;
          UNLOCK();
          if (*(int *)&(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_finish)->data == 0) {
            if (local_128 == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              (**(code **)(*(long *)local_128 + 0x18))();
            }
          }
        }
        piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar16 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 != 0) {
          return 0;
        }
        if (local_1d8.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_1d8.allocator + 0x18))();
          return 0;
        }
LAB_004a398a:
        free(local_1d8.data);
        return 0;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (&_bottom_blobs,2,(allocator_type *)&local_1d8);
      pMVar9 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start != pMVar20) {
        piVar16 = pMVar20->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if ((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
              free((_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start)->data);
            }
            else {
              (**(code **)(*(long *)(_bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))()
              ;
            }
          }
        }
        pMVar9->cstep = 0;
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar9->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar9->elemsize + 4) = 0;
        pMVar9->c = 0;
        pMVar9->dims = 0;
        pMVar9->w = 0;
        pMVar9->h = 0;
        pMVar9->d = 0;
        piVar16 = pMVar20->refcount;
        pMVar9->data = pMVar20->data;
        pMVar9->refcount = piVar16;
        pMVar9->elemsize = pMVar20->elemsize;
        pMVar9->elempack = pMVar20->elempack;
        pMVar9->allocator = pMVar20->allocator;
        iVar27 = pMVar20->w;
        iVar24 = pMVar20->h;
        iVar29 = pMVar20->d;
        pMVar9->dims = pMVar20->dims;
        pMVar9->w = iVar27;
        pMVar9->h = iVar24;
        pMVar9->d = iVar29;
        pMVar9->c = pMVar20->c;
        pMVar9->cstep = pMVar20->cstep;
      }
      iVar24 = 1;
      iVar27 = pMVar20[1].w;
      if (*(int *)(&local_150->field_0xd0 + (long)local_150->_vptr_MatMul_x86[-3]) == 0) {
        iVar24 = pMVar20[1].w;
        iVar27 = 1;
      }
      Mat::reshape(&local_1d8,local_160,iVar27,iVar24,(Allocator *)0x0);
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_start + 1 != &local_1d8) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
              free(_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start[1].data);
            }
            else {
              (**(code **)(*(long *)_bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start[1].allocator + 0x18))()
              ;
            }
          }
        }
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].data = local_1d8.data;
        piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].refcount = piVar16;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elemsize =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].elempack = local_1d8.elempack;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].allocator = local_1d8.allocator;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].dims = local_1d8.dims;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].w = local_1d8.w;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].h = local_1d8.h;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].d = local_1d8.d;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].c = local_1d8.c;
        _bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start[1].cstep = local_1d8.cstep;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            free(local_1d8.data);
          }
          else {
            (**(code **)(*(long *)local_1d8.allocator + 0x18))();
          }
        }
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&_bottom_blobs,local_178,opt);
      Mat::reshape(&local_1d8,this_00,this_00->h,opt->blob_allocator);
      piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (this_00 != &local_1d8) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = this_00->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (this_00->allocator == (Allocator *)0x0) {
              free(this_00->data);
            }
            else {
              (**(code **)(*(long *)this_00->allocator + 0x18))();
            }
          }
        }
        this_00->data = local_1d8.data;
        piVar16 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        this_00->refcount = piVar16;
        this_00->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        this_00->elempack = local_1d8.elempack;
        this_00->allocator = local_1d8.allocator;
        this_00->dims = local_1d8.dims;
        this_00->w = local_1d8.w;
        this_00->h = local_1d8.h;
        this_00->d = local_1d8.d;
        this_00->c = local_1d8.c;
        this_00->cstep = local_1d8.cstep;
      }
      if (piVar16 == (int *)0x0) goto LAB_004a28c2;
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) goto LAB_004a28c2;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_1d8.allocator + 0x18))();
        goto LAB_004a28c2;
      }
    }
  }
  free(local_1d8.data);
LAB_004a28c2:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&_bottom_blobs);
  return 0;
}

Assistant:

int MatMul_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}